

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall
ON_PlaneSurface::Split
          (ON_PlaneSurface *this,int dir,double c,ON_Surface **west_or_south_side,
          ON_Surface **east_or_north_side)

{
  bool bVar1;
  ON_PlaneSurface *pOVar2;
  double dVar3;
  ON_Interval local_b0;
  ON_Interval local_a0;
  ON_Interval local_90;
  ON_Interval local_80;
  ON_Interval local_70;
  ON_Surface **local_60;
  double t;
  ON_PlaneSurface *local_48;
  ON_PlaneSurface *en_side;
  ON_PlaneSurface *ws_side;
  ON_Surface **east_or_north_side_local;
  ON_Surface **west_or_south_side_local;
  double c_local;
  ON_PlaneSurface *pOStack_18;
  int dir_local;
  ON_PlaneSurface *this_local;
  
  en_side = (ON_PlaneSurface *)0x0;
  local_48 = (ON_PlaneSurface *)0x0;
  if ((dir < 0) || (1 < dir)) {
    this_local._7_1_ = false;
  }
  else {
    ws_side = (ON_PlaneSurface *)east_or_north_side;
    east_or_north_side_local = west_or_south_side;
    west_or_south_side_local = (ON_Surface **)c;
    c_local._4_4_ = dir;
    pOStack_18 = this;
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
              (this,(ulong)(uint)dir);
    bVar1 = ON_Interval::Includes((ON_Interval *)&t,(double)west_or_south_side_local,true);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (this,(ulong)c_local._4_4_);
      local_80 = Extents(this,c_local._4_4_);
      bVar1 = ON_Interval::operator==(&local_70,&local_80);
      if (bVar1) {
        local_60 = west_or_south_side_local;
      }
      else {
        local_90 = Extents(this,c_local._4_4_);
        dVar3 = local_90.m_t[1];
        (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                  (this,(ulong)c_local._4_4_);
        local_a0.m_t[1] = dVar3;
        dVar3 = ON_Interval::NormalizedParameterAt(&local_a0,(double)west_or_south_side_local);
        local_60 = (ON_Surface **)ON_Interval::ParameterAt(&local_90,dVar3);
        local_b0 = Extents(this,c_local._4_4_);
        bVar1 = ON_Interval::Includes(&local_b0,(double)local_60,true);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
      }
      if (*east_or_north_side_local != (ON_Surface *)0x0) {
        if (*east_or_north_side_local ==
            (ON_Surface *)
            (ws_side->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object) {
          return false;
        }
        en_side = Cast((ON_Object *)*east_or_north_side_local);
        if (en_side == (ON_PlaneSurface *)0x0) {
          return false;
        }
      }
      if (((ws_side->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object ==
           (_func_int **)0x0) ||
         (local_48 = Cast((ON_Object *)
                          (ws_side->super_ON_Surface).super_ON_Geometry.super_ON_Object.
                          _vptr_ON_Object), local_48 != (ON_PlaneSurface *)0x0)) {
        if (en_side == (ON_PlaneSurface *)0x0) {
          pOVar2 = (ON_PlaneSurface *)operator_new(0xd0);
          ON_PlaneSurface(pOVar2);
          en_side = pOVar2;
        }
        if (local_48 == (ON_PlaneSurface *)0x0) {
          pOVar2 = (ON_PlaneSurface *)operator_new(0xd0);
          ON_PlaneSurface(pOVar2);
          local_48 = pOVar2;
        }
        operator=(en_side,this);
        operator=(local_48,this);
        *(ON_Surface ***)(&en_side->field_0x98 + (long)(int)c_local._4_4_ * 0x10) =
             west_or_south_side_local;
        *(ON_Surface ***)(&local_48->field_0x90 + (long)(int)c_local._4_4_ * 0x10) =
             west_or_south_side_local;
        *(ON_Surface ***)(&en_side->field_0xb8 + (long)(int)c_local._4_4_ * 0x10) = local_60;
        *(ON_Surface ***)(&local_48->field_0xb0 + (long)(int)c_local._4_4_ * 0x10) = local_60;
        *east_or_north_side_local = &en_side->super_ON_Surface;
        (ws_side->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
             (_func_int **)local_48;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PlaneSurface::Split(
       int dir,
       double c,
       ON_Surface*& west_or_south_side,
       ON_Surface*& east_or_north_side
       ) const
{
  ON_PlaneSurface* ws_side = 0;
  ON_PlaneSurface* en_side = 0;

  if ( dir < 0 || dir > 1 )
    return false;
  if ( !Domain(dir).Includes(c,true) )
    return false;

  double t;
  if ( Domain(dir) == Extents(dir) )
    t = c;
  else
  {
    t = Extents(dir).ParameterAt( Domain(dir).NormalizedParameterAt(c) );
    if ( !Extents(dir).Includes(t,true) )
      return false;
  }

  if ( west_or_south_side )
  {
    if ( west_or_south_side == east_or_north_side )
      return false;
    ws_side = ON_PlaneSurface::Cast(west_or_south_side);
    if ( !ws_side )
      return false;
  }

  if ( east_or_north_side )
  {
    en_side = ON_PlaneSurface::Cast(east_or_north_side);
    if ( !en_side )
      return false;
  }

  if ( !ws_side )
    ws_side = new ON_PlaneSurface();
  if ( !en_side )
    en_side = new ON_PlaneSurface();

  *ws_side = *this;
  *en_side = *this;
  ws_side->m_domain[dir].m_t[1] = c;
  en_side->m_domain[dir].m_t[0] = c;
  ws_side->m_extents[dir].m_t[1] = t;
  en_side->m_extents[dir].m_t[0] = t;

  west_or_south_side = ws_side;
  east_or_north_side = en_side;

  return true;
}